

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall diligent_spirv_cross::Compiler::flush_all_active_variables(Compiler *this)

{
  TypedID<(diligent_spirv_cross::Types)2> *pTVar1;
  size_t sVar2;
  uint *puVar3;
  SPIRVariable *pSVar4;
  long lVar5;
  Parameter *arg;
  Parameter *pPVar6;
  
  pTVar1 = (this->current_function->local_variables).
           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.ptr;
  sVar2 = (this->current_function->local_variables).
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.
          buffer_size;
  for (lVar5 = 0; sVar2 << 2 != lVar5; lVar5 = lVar5 + 4) {
    pSVar4 = get<diligent_spirv_cross::SPIRVariable>(this,*(uint32_t *)((long)&pTVar1->id + lVar5));
    flush_dependees(this,pSVar4);
  }
  pPVar6 = (this->current_function->arguments).
           super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>.ptr;
  for (lVar5 = (this->current_function->arguments).
               super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>.buffer_size * 0x14;
      lVar5 != 0; lVar5 = lVar5 + -0x14) {
    pSVar4 = get<diligent_spirv_cross::SPIRVariable>(this,(pPVar6->id).id);
    flush_dependees(this,pSVar4);
    pPVar6 = pPVar6 + 1;
  }
  puVar3 = (this->global_variables).super_VectorView<unsigned_int>.ptr;
  sVar2 = (this->global_variables).super_VectorView<unsigned_int>.buffer_size;
  for (lVar5 = 0; sVar2 << 2 != lVar5; lVar5 = lVar5 + 4) {
    pSVar4 = get<diligent_spirv_cross::SPIRVariable>(this,*(uint32_t *)((long)puVar3 + lVar5));
    flush_dependees(this,pSVar4);
  }
  flush_all_aliased_variables(this);
  return;
}

Assistant:

void Compiler::flush_all_active_variables()
{
	// Invalidate all temporaries we read from variables in this block since they were forwarded.
	// Invalidate all temporaries we read from globals.
	for (auto &v : current_function->local_variables)
		flush_dependees(get<SPIRVariable>(v));
	for (auto &arg : current_function->arguments)
		flush_dependees(get<SPIRVariable>(arg.id));
	for (auto global : global_variables)
		flush_dependees(get<SPIRVariable>(global));

	flush_all_aliased_variables();
}